

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_vtk.cpp
# Opt level: O0

void Omega_h::vtk::describe_array<double>(ostream *stream,string *name,Int ncomps)

{
  ostream *poVar1;
  char *pcVar2;
  Int ncomps_local;
  string *name_local;
  ostream *stream_local;
  
  poVar1 = std::operator<<(stream,"type=\"");
  pcVar2 = Traits<double,_void>::name();
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,"\"");
  poVar1 = std::operator<<(stream," Name=\"");
  poVar1 = std::operator<<(poVar1,(string *)name);
  std::operator<<(poVar1,"\"");
  poVar1 = std::operator<<(stream," NumberOfComponents=\"");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,ncomps);
  std::operator<<(poVar1,"\"");
  std::operator<<(stream," format=\"binary\"");
  return;
}

Assistant:

void describe_array(std::ostream& stream, std::string const& name, Int ncomps) {
  stream << "type=\"" << Traits<T>::name() << "\"";
  stream << " Name=\"" << name << "\"";
  stream << " NumberOfComponents=\"" << ncomps << "\"";
  stream << " format=\"binary\"";
}